

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O2

void composition_solid_source_atop(uint32_t *dest,int length,uint32_t color,uint32_t const_alpha)

{
  uint32_t uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (const_alpha != 0xff) {
    color = BYTE_MUL(color,const_alpha);
  }
  uVar3 = 0;
  uVar2 = (ulong)(uint)length;
  if (length < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    uVar1 = INTERPOLATE_PIXEL(color,dest[uVar3] >> 0x18,dest[uVar3],~color >> 0x18);
    dest[uVar3] = uVar1;
  }
  return;
}

Assistant:

static void composition_solid_source_atop(uint32_t* dest, int length, uint32_t color, uint32_t const_alpha)
{
    if(const_alpha != 255)
        color = BYTE_MUL(color, const_alpha);
    uint32_t sia = plutovg_alpha(~color);
    for(int i = 0; i < length; i++) {
        uint32_t d = dest[i];
        dest[i] = INTERPOLATE_PIXEL(color, plutovg_alpha(d), d, sia);
    }
}